

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_surjectionproof_parse
              (secp256k1_context *ctx,secp256k1_surjectionproof *proof,uchar *input,size_t inputlen)

{
  ulong uVar1;
  ulong uVar2;
  ulong __n;
  ulong uVar3;
  long lVar4;
  size_t __n_00;
  
  if (proof == (secp256k1_surjectionproof *)0x0) {
    secp256k1_surjectionproof_parse_cold_2();
  }
  else {
    if (input != (uchar *)0x0) {
      if (inputlen < 2) {
        return 0;
      }
      uVar3 = (ulong)*(ushort *)input;
      if (0x100 < uVar3) {
        return 0;
      }
      __n = (ulong)(*(ushort *)input + 7 >> 3);
      uVar1 = __n + 2;
      if (inputlen < uVar1) {
        return 0;
      }
      if (((*input & 7) != 0) && (input[__n + 1] >> (*input & 7) != 0)) {
        return 0;
      }
      if (uVar3 == 0) {
        __n_00 = 0x20;
      }
      else {
        uVar2 = 0;
        lVar4 = 0;
        do {
          lVar4 = lVar4 + (ulong)(((uint)(input + 2)[uVar2] * 0x8040201 >> 3 & 0x11111111) *
                                  0x11111111 >> 0x1c);
          uVar2 = uVar2 + 1;
        } while (__n != uVar2);
        __n_00 = lVar4 * 0x20 + 0x20;
      }
      if (__n_00 + uVar1 != inputlen) {
        return 0;
      }
      proof->n_inputs = uVar3;
      memcpy(proof->used_inputs,input + 2,__n);
      memcpy(proof->data,input + uVar1,__n_00);
      return 1;
    }
    secp256k1_surjectionproof_parse_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_surjectionproof_parse(const secp256k1_context* ctx, secp256k1_surjectionproof *proof, const unsigned char *input, size_t inputlen) {
    size_t n_inputs;
    size_t signature_len;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(proof != NULL);
    ARG_CHECK(input != NULL);
    (void) ctx;

    if (inputlen < 2) {
        return 0;
    }
    n_inputs = ((size_t) (input[1] << 8)) + input[0];
    if (n_inputs > SECP256K1_SURJECTIONPROOF_MAX_N_INPUTS) {
        return 0;
    }
    if (inputlen < 2 + (n_inputs + 7) / 8) {
        return 0;
    }

    /* Check that the bitvector of used inputs is of the claimed
     * length; i.e. the final byte has no "padding bits" set */
    if (n_inputs % 8 != 0) {
        const unsigned char padding_mask = (~0U) << (n_inputs % 8);
        if ((input[2 + (n_inputs + 7) / 8 - 1] & padding_mask) != 0) {
            return 0;
        }
    }

    signature_len = 32 * (1 + secp256k1_count_bits_set(&input[2], (n_inputs + 7) / 8));
    if (inputlen != 2 + (n_inputs + 7) / 8 + signature_len) {
        return 0;
    }
    proof->n_inputs = n_inputs;
    memcpy(proof->used_inputs, &input[2], (n_inputs + 7) / 8);
    memcpy(proof->data, &input[2 + (n_inputs + 7) / 8], signature_len);

    return 1;
}